

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O0

string * util::fs::get_cwd_string_abi_cxx11_(void)

{
  char *pcVar1;
  char *pcVar2;
  Exception *this;
  string *in_RDI;
  allocator local_59;
  string local_58 [54];
  allocator local_22;
  undefined1 local_21;
  char *local_20;
  char *buf;
  size_t size;
  string *ret;
  
  buf = (char *)0x100;
  do {
    local_20 = (char *)operator_new__((ulong)buf);
    pcVar2 = get_cwd(local_20,(size_t)buf);
    pcVar1 = local_20;
    if (pcVar2 == local_20) {
      local_21 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,pcVar1,&local_22);
      std::allocator<char>::~allocator((allocator<char> *)&local_22);
      if (local_20 != (char *)0x0) {
        operator_delete__(local_20);
      }
      return in_RDI;
    }
    if (local_20 != (char *)0x0) {
      operator_delete__(local_20);
    }
    buf = (char *)((long)buf << 1);
  } while (buf < (char *)0x8001);
  this = (Exception *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"Error storing CWD",&local_59);
  Exception::Exception(this,(string *)local_58);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

std::string
get_cwd_string (void)
{
    std::size_t size = 1 << 8;
    while (true)
    {
        char* buf = new char[size];
        if (get_cwd(buf, size) == buf)
        {
            std::string ret(buf);
            delete[] buf;
            return ret;
        }
        delete[] buf;
        size = size << 1;
        if (size > (1 << 15))
            throw Exception("Error storing CWD");
    }
}